

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestResult::RecordProperty
          (TestResult *this,string *xml_element,TestProperty *test_property)

{
  bool bVar1;
  char *pcVar2;
  pointer this_00;
  allocator<char> local_c1;
  string local_c0;
  uint local_9c;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  local_98;
  allocator<char> local_8d [13];
  string local_80;
  TestPropertyKeyIs local_60;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  local_40;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  local_38;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  local_30;
  iterator property_with_matching_key;
  MutexLock lock;
  TestProperty *test_property_local;
  string *xml_element_local;
  TestResult *this_local;
  
  bVar1 = ValidateTestProperty(xml_element,test_property);
  if (bVar1) {
    internal::GTestMutexLock::GTestMutexLock
              ((GTestMutexLock *)&property_with_matching_key,(MutexBase *)this);
    local_38._M_current =
         (TestProperty *)
         std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::begin
                   (&this->test_properties_);
    local_40._M_current =
         (TestProperty *)
         std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::end
                   (&this->test_properties_);
    pcVar2 = TestProperty::key(test_property);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar2,local_8d);
    internal::TestPropertyKeyIs::TestPropertyKeyIs(&local_60,&local_80);
    local_30 = std::
               find_if<__gnu_cxx::__normal_iterator<testing::TestProperty*,std::vector<testing::TestProperty,std::allocator<testing::TestProperty>>>,testing::internal::TestPropertyKeyIs>
                         (local_38,local_40,&local_60);
    internal::TestPropertyKeyIs::~TestPropertyKeyIs(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(local_8d);
    local_98._M_current =
         (TestProperty *)
         std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::end
                   (&this->test_properties_);
    bVar1 = __gnu_cxx::operator==(&local_30,&local_98);
    if (bVar1) {
      std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::push_back
                (&this->test_properties_,test_property);
    }
    else {
      this_00 = __gnu_cxx::
                __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
                ::operator->(&local_30);
      pcVar2 = TestProperty::value(test_property);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar2,&local_c1);
      TestProperty::SetValue(this_00,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
    }
    local_9c = (uint)bVar1;
    internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)&property_with_matching_key);
  }
  return;
}

Assistant:

void TestResult::RecordProperty(const std::string& xml_element,
                                const TestProperty& test_property) {
  if (!ValidateTestProperty(xml_element, test_property)) {
    return;
  }
  internal::MutexLock lock(&test_properites_mutex_);
  const std::vector<TestProperty>::iterator property_with_matching_key =
      std::find_if(test_properties_.begin(), test_properties_.end(),
                   internal::TestPropertyKeyIs(test_property.key()));
  if (property_with_matching_key == test_properties_.end()) {
    test_properties_.push_back(test_property);
    return;
  }
  property_with_matching_key->SetValue(test_property.value());
}